

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_test.cpp
# Opt level: O1

void operations_test<viennamath::ct_constant<8l>,viennamath::ct_constant<8l>>
               (ct_constant<8L> *t,ct_constant<8L> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_constant<64L> local_2e;
  ct_constant<64L> local_2d;
  ct_constant<0L> local_2c;
  ct_constant<0L> local_2b;
  ct_constant<16L> local_2a;
  ct_constant<16L> local_29;
  double local_28;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_div<double>,_viennamath::ct_constant<8L>_>
  local_1c;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_div<double>,_viennamath::ct_constant<8L>_>
  local_1a;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LHS: ",5);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::ostream::_M_insert<double>(t2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), RHS: ",8);
  poVar1 = viennamath::operator<<(poVar1,u);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::ostream::_M_insert<double>(u2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_28 = t2 + u2;
  evaluations_test<viennamath::ct_constant<16l>>(&local_29,local_28);
  evaluations_test<viennamath::ct_constant<16l>>(&local_2a,local_28);
  evaluations_test<viennamath::ct_constant<0l>>(&local_2b,t2 - u2);
  evaluations_test<viennamath::ct_constant<0l>>(&local_2c,u2 - t2);
  local_28 = t2 * u2;
  evaluations_test<viennamath::ct_constant<64l>>(&local_2d,local_28);
  evaluations_test<viennamath::ct_constant<64l>>(&local_2e,local_28);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_div<double>,viennamath::ct_constant<8l>>>
            (&local_1a,t2 / u2);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_div<double>,viennamath::ct_constant<8l>>>
            (&local_1c,u2 / t2);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << " (" << t2 << "), RHS: " << u << "(" << u2 << ")" << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}